

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printTestsEnded(TestOutput *this,TestResult *result)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t failureCount;
  bool isFailure;
  TestResult *result_local;
  TestOutput *this_local;
  
  (*this->_vptr_TestOutput[0xb])(this,"\n");
  bVar1 = TestResult::isFailure(result);
  sVar2 = TestResult::getFailureCount(result);
  if (bVar1) {
    if ((this->color_ & 1U) != 0) {
      (*this->_vptr_TestOutput[0xb])(this,"\x1b[31;1m");
    }
    (*this->_vptr_TestOutput[0xb])(this,"Errors (");
    if (sVar2 == 0) {
      (*this->_vptr_TestOutput[0xb])(this,"ran nothing, ");
    }
    else {
      (*this->_vptr_TestOutput[0xd])(this,sVar2);
      (*this->_vptr_TestOutput[0xb])(this," failures, ");
    }
  }
  else {
    if ((this->color_ & 1U) != 0) {
      (*this->_vptr_TestOutput[0xb])(this,"\x1b[32;1m");
    }
    (*this->_vptr_TestOutput[0xb])(this,"OK (");
  }
  sVar3 = TestResult::getTestCount(result);
  (*this->_vptr_TestOutput[0xd])(this,sVar3);
  (*this->_vptr_TestOutput[0xb])(this," tests, ");
  sVar3 = TestResult::getRunCount(result);
  (*this->_vptr_TestOutput[0xd])(this,sVar3);
  (*this->_vptr_TestOutput[0xb])(this," ran, ");
  sVar3 = TestResult::getCheckCount(result);
  (*this->_vptr_TestOutput[0xd])(this,sVar3);
  (*this->_vptr_TestOutput[0xb])(this," checks, ");
  sVar3 = TestResult::getIgnoredCount(result);
  (*this->_vptr_TestOutput[0xd])(this,sVar3);
  (*this->_vptr_TestOutput[0xb])(this," ignored, ");
  sVar3 = TestResult::getFilteredOutCount(result);
  (*this->_vptr_TestOutput[0xd])(this,sVar3);
  (*this->_vptr_TestOutput[0xb])(this," filtered out, ");
  sVar3 = TestResult::getTotalExecutionTime(result);
  (*this->_vptr_TestOutput[0xd])(this,sVar3);
  (*this->_vptr_TestOutput[0xb])(this," ms)");
  if ((this->color_ & 1U) != 0) {
    (*this->_vptr_TestOutput[0xb])(this,"\x1b[m");
  }
  if ((bVar1) && (sVar2 == 0)) {
    (*this->_vptr_TestOutput[0xb])
              (this,
               "\nNote: test run failed because no tests were run or ignored. Assuming something went wrong. This often happens because of linking errors or typos in test filter."
              );
  }
  (*this->_vptr_TestOutput[0xb])(this,"\n\n");
  this->dotCount_ = 0;
  return;
}

Assistant:

void TestOutput::printTestsEnded(const TestResult& result)
{
    print("\n");
    const bool isFailure = result.isFailure();
    const size_t failureCount = result.getFailureCount();
    if (isFailure) {
        if (color_) {
            print("\033[31;1m");
        }
        print("Errors (");
        if (failureCount > 0) {
            print(failureCount);
            print(" failures, ");
        }
        else {
            print("ran nothing, ");
        }
    }
    else {
        if (color_) {
            print("\033[32;1m");
        }
        print("OK (");
    }
    print(result.getTestCount());
    print(" tests, ");
    print(result.getRunCount());
    print(" ran, ");
    print(result.getCheckCount());
    print(" checks, ");
    print(result.getIgnoredCount());
    print(" ignored, ");
    print(result.getFilteredOutCount());
    print(" filtered out, ");
    print(result.getTotalExecutionTime());
    print(" ms)");
    if (color_) {
        print("\033[m");
    }
    if (isFailure && failureCount == 0) {
        print("\nNote: test run failed because no tests were run or ignored. Assuming something went wrong. "
              "This often happens because of linking errors or typos in test filter.");
    }
    print("\n\n");

    dotCount_ = 0;
}